

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O2

bool __thiscall
QDirListingPrivate::matchesLegacyFilters(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  QStringView fileName;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long in_FS_OFFSET;
  long in_stack_ffffffffffffffd0;
  storage_type_conflict *psVar4;
  
  psVar4 = *(storage_type_conflict **)(in_FS_OFFSET + 0x28);
  QDirEntryInfo::fileName((QString *)&stack0xffffffffffffffc0,entryInfo);
  if (in_stack_ffffffffffffffd0 != 0) {
    fileName.m_data = psVar4;
    fileName.m_size = in_stack_ffffffffffffffd0;
    bVar1 = isDotOrDotDot(fileName);
    uVar3 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
            super_QFlagsStorage<QDir::Filter>.i;
    if (((((((!bVar1) || (in_stack_ffffffffffffffd0 != 1)) || ((uVar3 & 0x2000) == 0)) &&
          ((bVar1 & in_stack_ffffffffffffffd0 == 2 & (byte)(uVar3 >> 0xe) & 1) == 0)) &&
         ((((uVar3 >> 10 & 1) != 0 && (bVar2 = QDirEntryInfo::isDir(entryInfo), bVar2)) ||
          (bVar2 = regexMatchesName(this,(QString *)&stack0xffffffffffffffc0), bVar2)))) &&
        ((((uVar3 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                    super_QFlagsStorage<QDir::Filter>.i, (uVar3 & 8) == 0 ||
           (bVar2 = QDirEntryInfo::isSymLink(entryInfo), !bVar2)) ||
          (((uVar3 >> 9 & 1) != 0 && (bVar2 = QDirEntryInfo::exists(entryInfo), !bVar2)))) &&
         ((bVar1 || ((this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                     super_QFlagsStorage<QDir::Filter>.i & 0x100) != 0 ||
          (bVar1 = QDirEntryInfo::isHidden(entryInfo), !bVar1)))))) &&
       (((uVar3 >> 9 & 1) != 0 ||
        ((((bVar1 = QDirEntryInfo::isFile(entryInfo), bVar1 ||
           (bVar1 = QDirEntryInfo::isDir(entryInfo), bVar1)) ||
          (bVar1 = QDirEntryInfo::isSymLink(entryInfo), bVar1)) &&
         ((bVar1 = QDirEntryInfo::isSymLink(entryInfo), !bVar1 ||
          (bVar1 = QDirEntryInfo::exists(entryInfo), bVar1)))))))) {
      uVar3 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
              super_QFlagsStorage<QDir::Filter>.i;
      if ((uVar3 & 0x401) == 0) {
        bVar1 = QDirEntryInfo::isDir(entryInfo);
        if (bVar1) goto LAB_0021a176;
        uVar3 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                super_QFlagsStorage<QDir::Filter>.i;
      }
      if ((uVar3 & 2) == 0) {
        bVar1 = QDirEntryInfo::isFile(entryInfo);
        if (bVar1) goto LAB_0021a176;
        uVar3 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                super_QFlagsStorage<QDir::Filter>.i;
      }
      bVar1 = true;
      if ((((uVar3 & 0x70) == 0) || ((uVar3 & 0x70) == 0x70)) ||
         (((((uVar3 & 0x10) == 0 || (bVar2 = QDirEntryInfo::isReadable(entryInfo), bVar2)) &&
           (((uVar3 & 0x20) == 0 || (bVar2 = QDirEntryInfo::isWritable(entryInfo), bVar2)))) &&
          (((uVar3 & 0x40) == 0 || (bVar2 = QDirEntryInfo::isExecutable(entryInfo), bVar2))))))
      goto LAB_0021a178;
    }
  }
LAB_0021a176:
  bVar1 = false;
LAB_0021a178:
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffc0);
  if (*(storage_type_conflict **)(in_FS_OFFSET + 0x28) != psVar4) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QDirListingPrivate::matchesLegacyFilters(QDirEntryInfo &entryInfo) const
{
    Q_ASSERT(useLegacyFilters);

    const QString &fileName = entryInfo.fileName();
    if (fileName.isEmpty())
        return false;

    auto &filters = legacyDirFilters;

    // filter . and ..?
    const bool dotOrDotDot = isDotOrDotDot(fileName);
    const qsizetype fileNameSize = fileName.size();
    if ((filters & QDir::NoDot) && dotOrDotDot && fileNameSize == 1)
        return false;
    if ((filters & QDir::NoDotDot) && dotOrDotDot && fileNameSize == 2)
        return false;

    // name filter
#if QT_CONFIG(regularexpression)
    // Pass all entries through name filters, except dirs if AllDirs is set
    if (!(filters.testAnyFlags(QDir::AllDirs) && entryInfo.isDir())) {
        if (!regexMatchesName(fileName))
            return false;
    }
#endif
    // skip symlinks
    const bool skipSymlinks = filters.testAnyFlag(QDir::NoSymLinks);
    const bool includeSystem = filters.testAnyFlag(QDir::System);
    if (skipSymlinks && entryInfo.isSymLink()) {
        // The only reason to save this file is if it is a broken link and we are requesting system files.
        if (!includeSystem || entryInfo.exists())
            return false;
    }

    // filter hidden
    const bool includeHidden = filters.testAnyFlag(QDir::Hidden);
    if (!includeHidden && !dotOrDotDot && entryInfo.isHidden())
        return false;

    // filter system files
    if (!includeSystem) {
        if (!entryInfo.isFile() && !entryInfo.isDir() && !entryInfo.isSymLink())
            return false;
        if (entryInfo.isSymLink() && !entryInfo.exists())
            return false;
    }

    // skip directories
    const bool skipDirs = !(filters & (QDir::Dirs | QDir::AllDirs));
    if (skipDirs && entryInfo.isDir())
        return false;

    // skip files
    const bool skipFiles    = !(filters & QDir::Files);
    if (skipFiles && entryInfo.isFile())
        // Basically we need a reason not to exclude this file otherwise we just eliminate it.
        return false;

    // filter permissions
    const auto perms = filters & QDir::PermissionMask;
    const bool filterPermissions = perms != 0 && perms != QDir::PermissionMask;
    if (filterPermissions) {
        const bool doWritable = filters.testAnyFlags(QDir::Writable);
        const bool doExecutable = filters.testAnyFlags(QDir::Executable);
        const bool doReadable = filters.testAnyFlags(QDir::Readable);
        if ((doReadable && !entryInfo.isReadable())
            || (doWritable && !entryInfo.isWritable())
            || (doExecutable && !entryInfo.isExecutable())) {
            return false;
        }
    }

    return true;
}